

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void scale_to(values_t *values,double length)

{
  bool bVar1;
  double dVar2;
  reference pvVar3;
  reference pdVar4;
  double dVar5;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_48;
  iterator i_1;
  double max;
  double min;
  size_type i;
  size_t max_v;
  size_t min_v;
  double length_local;
  values_t *values_local;
  
  max_v = 0;
  i = 0;
  min = 0.0;
  while( true ) {
    dVar2 = (double)std::vector<double,_std::allocator<double>_>::size(values);
    if ((ulong)dVar2 <= (ulong)min) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](values,max_v);
    dVar2 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](values,(size_type)min);
    if (*pvVar3 <= dVar2 && dVar2 != *pvVar3) {
      max_v = (size_t)min;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](values,i);
    dVar2 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](values,(size_type)min);
    if (dVar2 < *pvVar3) {
      i = (size_type)min;
    }
    min = (double)((long)min + 1);
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](values,max_v);
  dVar2 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](values,i);
  i_1._M_current = (double *)(*pvVar3 - dVar2);
  local_48._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(values);
  while( true ) {
    local_50._M_current = (double *)std::vector<double,_std::allocator<double>_>::end(values);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    if (((double)i_1._M_current != 0.0) || (NAN((double)i_1._M_current))) {
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_48);
      dVar5 = (length * (*pdVar4 - dVar2)) / (double)i_1._M_current;
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_48);
      *pdVar4 = dVar5;
    }
    else {
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_48);
      *pdVar4 = 0.0;
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_48,0);
  }
  return;
}

Assistant:

void scale_to(values_t& values, double length = 1.0)
{
    size_t min_v = 0;
    size_t max_v = 0;
    for (values_t::size_type i = 0; i < values.size(); i++)
    {
        if (values[min_v] > values[i])
        {
            min_v = i;
        }
        if (values[max_v] < values[i])
        {
            max_v = i;
        }
    }

    double min = values[min_v];
    double max = values[max_v] - min;
    for (values_t::iterator i = values.begin(); i != values.end(); i++)
    {
        if (0 != max)
        {
            *i = length*(*i - min)/max;
        } else
        {
            *i = 0;
        }
    }
}